

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall Rml::ElementDocument::UpdatePosition(ElementDocument *this)

{
  Vector2f VVar1;
  Vector2f VVar2;
  Element *this_00;
  Element *pEVar3;
  Box *pBVar4;
  ComputedValues *pCVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  if (this->position_dirty == true) {
    this->position_dirty = false;
    this_00 = Element::GetParentNode(&this->super_Element);
    if ((this_00 != (Element *)0x0) && (this->context != (Context *)0x0)) {
      pEVar3 = Context::GetRootElement(this->context);
      if (this_00 == pEVar3) {
        pBVar4 = Element::GetBox(this_00);
        VVar1 = Box::GetSize(pBVar4);
        pCVar5 = Element::GetComputedValues(&this->super_Element);
        pBVar4 = Element::GetBox(&this->super_Element);
        uVar6 = *(ulong *)&pCVar5->common >> 0x28 & 3;
        local_48 = VVar1.x;
        if (uVar6 == 0) {
          if ((*(ulong *)&pCVar5->common & 0x3000000000) == 0) {
            local_48 = 0.0;
          }
          else {
            VVar2 = Box::GetSize(pBVar4,Margin);
            fVar7 = ResolveValue((LengthPercentageAuto)
                                 (CONCAT44((pCVar5->common).right_value,
                                           (uint)((ulong)*(undefined8 *)&pCVar5->common >> 0x24)) &
                                 0xffffffff00000003),local_48);
            local_38 = VVar2.x;
            local_48 = local_48 - (fVar7 + local_38);
          }
        }
        else {
          local_48 = ResolveValue((LengthPercentageAuto)
                                  ((ulong)(uint)(pCVar5->common).left_value << 0x20 | uVar6),
                                  local_48);
        }
        uVar6 = *(ulong *)&pCVar5->common >> 0x22 & 3;
        fStack_34 = 0.0;
        fStack_44 = VVar1.y;
        if (uVar6 == 0) {
          if ((*(ulong *)&pCVar5->common & 0xc000000000) != 0) {
            VVar1 = Box::GetSize(pBVar4,Margin);
            fVar7 = ResolveValue((LengthPercentageAuto)
                                 (CONCAT44((pCVar5->common).bottom_value,
                                           (uint)((ulong)*(undefined8 *)&pCVar5->common >> 0x26)) &
                                 0xffffffff00000003),fStack_44);
            fStack_34 = fStack_44 - (fVar7 + VVar1.y);
          }
        }
        else {
          fStack_34 = ResolveValue((LengthPercentageAuto)
                                   ((ulong)(uint)(pCVar5->common).top_value << 0x20 | uVar6),
                                   fStack_44);
        }
        fVar7 = Box::GetEdge(pBVar4,Margin,Left);
        fVar8 = Box::GetEdge(pBVar4,Margin,Top);
        VVar1.y = fVar8 + fStack_34;
        VVar1.x = fVar7 + local_48;
        Element::SetOffset(&this->super_Element,VVar1,(Element *)0x0,false);
        return;
      }
    }
  }
  return;
}

Assistant:

void ElementDocument::UpdatePosition()
{
	if (position_dirty)
	{
		RMLUI_ZoneScoped;

		position_dirty = false;

		Element* root = GetParentNode();

		// We only position ourselves if we are a child of our context's root element. That is, we don't want to proceed
		// if we are unparented or an iframe document.
		if (!root || !context || (root != context->GetRootElement()))
			return;

		// Work out our containing block; relative offsets are calculated against it.
		const Vector2f containing_block = root->GetBox().GetSize();
		auto& computed = GetComputedValues();
		const Box& box = GetBox();

		Vector2f position;

		if (computed.left().type != Style::Left::Auto)
			position.x = ResolveValue(computed.left(), containing_block.x);
		else if (computed.right().type != Style::Right::Auto)
			position.x = containing_block.x - (box.GetSize(BoxArea::Margin).x + ResolveValue(computed.right(), containing_block.x));

		if (computed.top().type != Style::Top::Auto)
			position.y = ResolveValue(computed.top(), containing_block.y);
		else if (computed.bottom().type != Style::Bottom::Auto)
			position.y = containing_block.y - (box.GetSize(BoxArea::Margin).y + ResolveValue(computed.bottom(), containing_block.y));

		// Add the margin edge to the position, since inset properties (top/right/bottom/left) set the margin edge
		// position, while offsets use the border edge.
		position.x += box.GetEdge(BoxArea::Margin, BoxEdge::Left);
		position.y += box.GetEdge(BoxArea::Margin, BoxEdge::Top);

		SetOffset(position, nullptr);
	}
}